

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Geometry *pGVar5;
  RTCIntersectArguments *pRVar6;
  RTCRayQueryContext *pRVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 (*pauVar10) [16];
  undefined4 uVar11;
  RayHit *pRVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  RayHit *pRVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  RayHit *pRVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  float fVar31;
  float fVar41;
  float fVar42;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar43;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar55;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar56;
  float fVar70;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar71;
  float fVar75;
  float fVar76;
  undefined1 auVar72 [16];
  float fVar77;
  undefined1 auVar73 [16];
  float fVar78;
  undefined1 auVar74 [16];
  float fVar93;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar94;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [64];
  float fVar99;
  float fVar100;
  float fVar109;
  undefined1 auVar101 [16];
  float fVar106;
  float fVar108;
  float fVar110;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar105;
  float fVar107;
  undefined1 auVar104 [64];
  float fVar111;
  undefined1 auVar112 [16];
  float fVar119;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar117;
  float fVar118;
  undefined1 auVar116 [64];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [64];
  float fVar123;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar124 [64];
  undefined1 auVar128 [64];
  float fVar129;
  undefined1 auVar130 [16];
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar131 [64];
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar136 [64];
  float fVar140;
  float fVar141;
  float fVar148;
  undefined1 auVar142 [16];
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar149;
  undefined1 auVar143 [64];
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar153 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1271;
  undefined1 (*local_1270) [16];
  ulong local_1268;
  ulong local_1260;
  RayQueryContext *local_1258;
  undefined1 local_124c [4];
  undefined1 local_1248 [8];
  float fStack_1240;
  float fStack_123c;
  undefined1 local_1238 [16];
  undefined1 local_1228 [16];
  undefined8 local_1218;
  float fStack_1210;
  float fStack_120c;
  undefined1 local_1208 [16];
  RTCFilterFunctionNArguments local_11f8;
  ulong local_11c8;
  ulong local_11c0;
  ulong local_11b8;
  ulong local_11b0;
  RayHit *local_11a8;
  ulong local_11a0;
  float local_1198;
  undefined4 local_1194;
  undefined4 local_1190;
  undefined4 local_118c;
  undefined4 local_1188;
  undefined4 local_1184;
  uint local_1180;
  uint local_117c;
  uint local_1178;
  undefined1 local_1168 [16];
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  undefined1 *local_1118;
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      auVar92 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      aVar1 = (ray->super_RayK<1>).dir.field_0;
      auVar44 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar91._8_4_ = 0x7fffffff;
      auVar91._0_8_ = 0x7fffffff7fffffff;
      auVar91._12_4_ = 0x7fffffff;
      auVar91 = vandps_avx((undefined1  [16])aVar1,auVar91);
      auVar79._8_4_ = 0x219392ef;
      auVar79._0_8_ = 0x219392ef219392ef;
      auVar79._12_4_ = 0x219392ef;
      auVar91 = vcmpps_avx(auVar91,auVar79,1);
      auVar80._8_4_ = 0x3f800000;
      auVar80._0_8_ = &DAT_3f8000003f800000;
      auVar80._12_4_ = 0x3f800000;
      auVar79 = vdivps_avx(auVar80,(undefined1  [16])aVar1);
      auVar81._8_4_ = 0x5d5e0b6b;
      auVar81._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar81._12_4_ = 0x5d5e0b6b;
      auVar91 = vblendvps_avx(auVar79,auVar81,auVar91);
      local_1270 = (undefined1 (*) [16])local_f68;
      auVar72._0_4_ = auVar91._0_4_ * 0.99999964;
      auVar72._4_4_ = auVar91._4_4_ * 0.99999964;
      auVar72._8_4_ = auVar91._8_4_ * 0.99999964;
      auVar72._12_4_ = auVar91._12_4_ * 0.99999964;
      auVar57._0_4_ = auVar91._0_4_ * 1.0000004;
      auVar57._4_4_ = auVar91._4_4_ * 1.0000004;
      auVar57._8_4_ = auVar91._8_4_ * 1.0000004;
      auVar57._12_4_ = auVar91._12_4_ * 1.0000004;
      uVar11 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_1018._4_4_ = uVar11;
      local_1018._0_4_ = uVar11;
      local_1018._8_4_ = uVar11;
      local_1018._12_4_ = uVar11;
      auVar104 = ZEXT1664(local_1018);
      uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_1028._4_4_ = uVar11;
      local_1028._0_4_ = uVar11;
      local_1028._8_4_ = uVar11;
      local_1028._12_4_ = uVar11;
      auVar116 = ZEXT1664(local_1028);
      uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_1038._4_4_ = uVar11;
      local_1038._0_4_ = uVar11;
      local_1038._8_4_ = uVar11;
      local_1038._12_4_ = uVar11;
      auVar122 = ZEXT1664(local_1038);
      local_1048 = vshufps_avx(auVar72,auVar72,0);
      auVar124 = ZEXT1664(local_1048);
      auVar91 = vmovshdup_avx(auVar72);
      local_1058 = vshufps_avx(auVar72,auVar72,0x55);
      auVar128 = ZEXT1664(local_1058);
      auVar79 = vshufpd_avx(auVar72,auVar72,1);
      local_1068 = vshufps_avx(auVar72,auVar72,0xaa);
      auVar131 = ZEXT1664(local_1068);
      local_1078 = vshufps_avx(auVar57,auVar57,0);
      auVar136 = ZEXT1664(local_1078);
      local_11b0 = (ulong)(auVar72._0_4_ < 0.0) << 4;
      local_1088 = vshufps_avx(auVar57,auVar57,0x55);
      auVar143 = ZEXT1664(local_1088);
      local_1098 = vshufps_avx(auVar57,auVar57,0xaa);
      auVar153 = ZEXT1664(local_1098);
      local_11b8 = (ulong)(auVar91._0_4_ < 0.0) << 4 | 0x20;
      local_11c0 = (ulong)(auVar79._0_4_ < 0.0) << 4 | 0x40;
      uVar16 = local_11b8 ^ 0x10;
      uVar19 = local_11c0 ^ 0x10;
      local_1168 = vshufps_avx(auVar92,auVar92,0);
      auVar98 = ZEXT1664(local_1168);
      auVar91 = vshufps_avx(auVar44,auVar44,0);
      auVar30 = ZEXT1664(auVar91);
      local_1158 = mm_lookupmask_ps._240_8_;
      uStack_1150 = mm_lookupmask_ps._248_8_;
      local_11c8 = local_11b0 ^ 0x10;
      uVar13 = local_11b0;
      uVar14 = local_11b0 ^ 0x10;
      uVar21 = local_11c0;
      uVar25 = local_11b8;
      local_1268 = uVar19;
      local_1260 = uVar16;
      local_1258 = context;
      do {
        do {
          do {
            if (local_1270 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar10 = local_1270 + -1;
            local_1270 = local_1270 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar10 + 8));
          uVar24 = *(ulong *)*local_1270;
          do {
            if ((uVar24 & 8) == 0) {
              auVar91 = vsubps_avx(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar13),auVar104._0_16_);
              auVar92._0_4_ = auVar124._0_4_ * auVar91._0_4_;
              auVar92._4_4_ = auVar124._4_4_ * auVar91._4_4_;
              auVar92._8_4_ = auVar124._8_4_ * auVar91._8_4_;
              auVar92._12_4_ = auVar124._12_4_ * auVar91._12_4_;
              auVar91 = vsubps_avx(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar25),auVar116._0_16_);
              auVar44._0_4_ = auVar128._0_4_ * auVar91._0_4_;
              auVar44._4_4_ = auVar128._4_4_ * auVar91._4_4_;
              auVar44._8_4_ = auVar128._8_4_ * auVar91._8_4_;
              auVar44._12_4_ = auVar128._12_4_ * auVar91._12_4_;
              auVar91 = vmaxps_avx(auVar92,auVar44);
              auVar79 = vsubps_avx(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar21),auVar122._0_16_);
              auVar45._0_4_ = auVar131._0_4_ * auVar79._0_4_;
              auVar45._4_4_ = auVar131._4_4_ * auVar79._4_4_;
              auVar45._8_4_ = auVar131._8_4_ * auVar79._8_4_;
              auVar45._12_4_ = auVar131._12_4_ * auVar79._12_4_;
              auVar79 = vmaxps_avx(auVar45,auVar98._0_16_);
              local_1148 = vmaxps_avx(auVar91,auVar79);
              auVar91 = vsubps_avx(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar14),auVar104._0_16_);
              auVar46._0_4_ = auVar136._0_4_ * auVar91._0_4_;
              auVar46._4_4_ = auVar136._4_4_ * auVar91._4_4_;
              auVar46._8_4_ = auVar136._8_4_ * auVar91._8_4_;
              auVar46._12_4_ = auVar136._12_4_ * auVar91._12_4_;
              auVar91 = vsubps_avx(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar16),auVar116._0_16_);
              auVar58._0_4_ = auVar143._0_4_ * auVar91._0_4_;
              auVar58._4_4_ = auVar143._4_4_ * auVar91._4_4_;
              auVar58._8_4_ = auVar143._8_4_ * auVar91._8_4_;
              auVar58._12_4_ = auVar143._12_4_ * auVar91._12_4_;
              auVar91 = vminps_avx(auVar46,auVar58);
              auVar79 = vsubps_avx(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar19),auVar122._0_16_);
              auVar59._0_4_ = auVar153._0_4_ * auVar79._0_4_;
              auVar59._4_4_ = auVar153._4_4_ * auVar79._4_4_;
              auVar59._8_4_ = auVar153._8_4_ * auVar79._8_4_;
              auVar59._12_4_ = auVar153._12_4_ * auVar79._12_4_;
              auVar79 = vminps_avx(auVar59,auVar30._0_16_);
              auVar91 = vminps_avx(auVar91,auVar79);
              auVar91 = vcmpps_avx(local_1148,auVar91,2);
              uVar11 = vmovmskps_avx(auVar91);
              local_11a0 = CONCAT44((int)(local_11a0 >> 0x20),uVar11);
            }
            if ((uVar24 & 8) == 0) {
              if (local_11a0 == 0) {
                iVar20 = 4;
              }
              else {
                uVar23 = uVar24 & 0xfffffffffffffff0;
                lVar15 = 0;
                if (local_11a0 != 0) {
                  for (; (local_11a0 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                  }
                }
                iVar20 = 0;
                uVar24 = *(ulong *)(uVar23 + lVar15 * 8);
                uVar17 = local_11a0 - 1 & local_11a0;
                if (uVar17 != 0) {
                  uVar3 = *(uint *)(local_1148 + lVar15 * 4);
                  lVar15 = 0;
                  if (uVar17 != 0) {
                    for (; (uVar17 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                    }
                  }
                  uVar4 = *(ulong *)(uVar23 + lVar15 * 8);
                  uVar2 = *(uint *)(local_1148 + lVar15 * 4);
                  uVar17 = uVar17 - 1 & uVar17;
                  uVar16 = local_1260;
                  uVar19 = local_1268;
                  if (uVar17 == 0) {
                    if (uVar3 < uVar2) {
                      *(ulong *)*local_1270 = uVar4;
                      *(uint *)(*local_1270 + 8) = uVar2;
                      local_1270 = local_1270 + 1;
                    }
                    else {
                      *(ulong *)*local_1270 = uVar24;
                      *(uint *)(*local_1270 + 8) = uVar3;
                      uVar24 = uVar4;
                      local_1270 = local_1270 + 1;
                    }
                  }
                  else {
                    auVar32._8_8_ = 0;
                    auVar32._0_8_ = uVar24;
                    auVar91 = vpunpcklqdq_avx(auVar32,ZEXT416(uVar3));
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = uVar4;
                    auVar79 = vpunpcklqdq_avx(auVar47,ZEXT416(uVar2));
                    lVar15 = 0;
                    if (uVar17 != 0) {
                      for (; (uVar17 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                      }
                    }
                    auVar60._8_8_ = 0;
                    auVar60._0_8_ = *(ulong *)(uVar23 + lVar15 * 8);
                    auVar44 = vpunpcklqdq_avx(auVar60,ZEXT416(*(uint *)(local_1148 + lVar15 * 4)));
                    auVar92 = vpcmpgtd_avx(auVar79,auVar91);
                    uVar17 = uVar17 - 1 & uVar17;
                    if (uVar17 == 0) {
                      auVar57 = vpshufd_avx(auVar92,0xaa);
                      auVar92 = vblendvps_avx(auVar79,auVar91,auVar57);
                      auVar91 = vblendvps_avx(auVar91,auVar79,auVar57);
                      auVar79 = vpcmpgtd_avx(auVar44,auVar92);
                      auVar57 = vpshufd_avx(auVar79,0xaa);
                      auVar79 = vblendvps_avx(auVar44,auVar92,auVar57);
                      auVar92 = vblendvps_avx(auVar92,auVar44,auVar57);
                      auVar44 = vpcmpgtd_avx(auVar92,auVar91);
                      auVar57 = vpshufd_avx(auVar44,0xaa);
                      auVar44 = vblendvps_avx(auVar92,auVar91,auVar57);
                      auVar91 = vblendvps_avx(auVar91,auVar92,auVar57);
                      *local_1270 = auVar91;
                      local_1270[1] = auVar44;
                      uVar24 = auVar79._0_8_;
                      local_1270 = local_1270 + 2;
                    }
                    else {
                      lVar15 = 0;
                      if (uVar17 != 0) {
                        for (; (uVar17 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                        }
                      }
                      auVar82._8_8_ = 0;
                      auVar82._0_8_ = *(ulong *)(uVar23 + lVar15 * 8);
                      auVar72 = vpunpcklqdq_avx(auVar82,ZEXT416(*(uint *)(local_1148 + lVar15 * 4)))
                      ;
                      auVar57 = vpshufd_avx(auVar92,0xaa);
                      auVar92 = vblendvps_avx(auVar79,auVar91,auVar57);
                      auVar91 = vblendvps_avx(auVar91,auVar79,auVar57);
                      auVar79 = vpcmpgtd_avx(auVar72,auVar44);
                      auVar57 = vpshufd_avx(auVar79,0xaa);
                      auVar79 = vblendvps_avx(auVar72,auVar44,auVar57);
                      auVar44 = vblendvps_avx(auVar44,auVar72,auVar57);
                      auVar57 = vpcmpgtd_avx(auVar44,auVar91);
                      auVar72 = vpshufd_avx(auVar57,0xaa);
                      auVar57 = vblendvps_avx(auVar44,auVar91,auVar72);
                      auVar91 = vblendvps_avx(auVar91,auVar44,auVar72);
                      auVar44 = vpcmpgtd_avx(auVar79,auVar92);
                      auVar72 = vpshufd_avx(auVar44,0xaa);
                      auVar44 = vblendvps_avx(auVar79,auVar92,auVar72);
                      auVar79 = vblendvps_avx(auVar92,auVar79,auVar72);
                      auVar92 = vpcmpgtd_avx(auVar57,auVar79);
                      auVar72 = vpshufd_avx(auVar92,0xaa);
                      auVar92 = vblendvps_avx(auVar57,auVar79,auVar72);
                      auVar79 = vblendvps_avx(auVar79,auVar57,auVar72);
                      *local_1270 = auVar91;
                      local_1270[1] = auVar79;
                      local_1270[2] = auVar92;
                      auVar98 = ZEXT1664(local_1168);
                      uVar24 = auVar44._0_8_;
                      local_1270 = local_1270 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar20 = 6;
            }
          } while (iVar20 == 0);
        } while (iVar20 != 6);
        pRVar12 = (RayHit *)((ulong)((uint)uVar24 & 0xf) - 8);
        local_11a8 = pRVar12;
        if (pRVar12 != (RayHit *)0x0) {
          uVar24 = uVar24 & 0xfffffffffffffff0;
          pRVar18 = (RayHit *)0x0;
          do {
            lVar15 = (long)pRVar18 * 0xb0;
            local_1118 = &local_1271;
            uVar11 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar33._4_4_ = uVar11;
            auVar33._0_4_ = uVar11;
            auVar33._8_4_ = uVar11;
            auVar33._12_4_ = uVar11;
            uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar48._4_4_ = uVar11;
            auVar48._0_4_ = uVar11;
            auVar48._8_4_ = uVar11;
            auVar48._12_4_ = uVar11;
            uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar61._4_4_ = uVar11;
            auVar61._0_4_ = uVar11;
            auVar61._8_4_ = uVar11;
            auVar61._12_4_ = uVar11;
            local_f88 = vsubps_avx(*(undefined1 (*) [16])(uVar24 + lVar15),auVar33);
            local_f98 = vsubps_avx(*(undefined1 (*) [16])(uVar24 + 0x10 + lVar15),auVar48);
            local_fa8 = vsubps_avx(*(undefined1 (*) [16])(uVar24 + 0x20 + lVar15),auVar61);
            auVar91 = vsubps_avx(*(undefined1 (*) [16])(uVar24 + 0x30 + lVar15),auVar33);
            local_1238 = vsubps_avx(*(undefined1 (*) [16])(uVar24 + 0x40 + lVar15),auVar48);
            auVar79 = vsubps_avx(*(undefined1 (*) [16])(uVar24 + 0x50 + lVar15),auVar61);
            auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar24 + 0x60 + lVar15),auVar33);
            auVar44 = vsubps_avx(*(undefined1 (*) [16])(uVar24 + 0x70 + lVar15),auVar48);
            auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar24 + 0x80 + lVar15),auVar61);
            local_fb8 = vsubps_avx(auVar92,local_f88);
            local_fc8 = vsubps_avx(auVar44,local_f98);
            local_fd8 = vsubps_avx(auVar57,local_fa8);
            fVar140 = local_f98._0_4_;
            fVar31 = fVar140 + auVar44._0_4_;
            fVar144 = local_f98._4_4_;
            fVar41 = fVar144 + auVar44._4_4_;
            fVar146 = local_f98._8_4_;
            fVar42 = fVar146 + auVar44._8_4_;
            fVar148 = local_f98._12_4_;
            fVar43 = fVar148 + auVar44._12_4_;
            fVar123 = local_fa8._0_4_;
            fVar71 = fVar123 + auVar57._0_4_;
            fVar125 = local_fa8._4_4_;
            fVar75 = fVar125 + auVar57._4_4_;
            fVar126 = local_fa8._8_4_;
            fVar76 = fVar126 + auVar57._8_4_;
            fVar127 = local_fa8._12_4_;
            fVar77 = fVar127 + auVar57._12_4_;
            fVar56 = local_fd8._0_4_;
            auVar112._0_4_ = fVar31 * fVar56;
            fVar70 = local_fd8._4_4_;
            auVar112._4_4_ = fVar41 * fVar70;
            fVar93 = local_fd8._8_4_;
            auVar112._8_4_ = fVar42 * fVar93;
            fVar94 = local_fd8._12_4_;
            auVar112._12_4_ = fVar43 * fVar94;
            fVar150 = local_fc8._0_4_;
            auVar120._0_4_ = fVar150 * fVar71;
            fVar154 = local_fc8._4_4_;
            auVar120._4_4_ = fVar154 * fVar75;
            fVar157 = local_fc8._8_4_;
            auVar120._8_4_ = fVar157 * fVar76;
            fVar160 = local_fc8._12_4_;
            auVar120._12_4_ = fVar160 * fVar77;
            auVar72 = vsubps_avx(auVar120,auVar112);
            fVar99 = local_f88._0_4_;
            fVar111 = fVar99 + auVar92._0_4_;
            fVar105 = local_f88._4_4_;
            fVar117 = fVar105 + auVar92._4_4_;
            fVar107 = local_f88._8_4_;
            fVar118 = fVar107 + auVar92._8_4_;
            fVar109 = local_f88._12_4_;
            fVar119 = fVar109 + auVar92._12_4_;
            fVar135 = local_fb8._0_4_;
            auVar73._0_4_ = fVar135 * fVar71;
            fVar137 = local_fb8._4_4_;
            auVar73._4_4_ = fVar137 * fVar75;
            fVar138 = local_fb8._8_4_;
            auVar73._8_4_ = fVar138 * fVar76;
            fVar139 = local_fb8._12_4_;
            auVar73._12_4_ = fVar139 * fVar77;
            auVar121._0_4_ = fVar111 * fVar56;
            auVar121._4_4_ = fVar117 * fVar70;
            auVar121._8_4_ = fVar118 * fVar93;
            auVar121._12_4_ = fVar119 * fVar94;
            auVar80 = vsubps_avx(auVar121,auVar73);
            auVar113._0_4_ = fVar111 * fVar150;
            auVar113._4_4_ = fVar117 * fVar154;
            auVar113._8_4_ = fVar118 * fVar157;
            auVar113._12_4_ = fVar119 * fVar160;
            auVar34._0_4_ = fVar135 * fVar31;
            auVar34._4_4_ = fVar137 * fVar41;
            auVar34._8_4_ = fVar138 * fVar42;
            auVar34._12_4_ = fVar139 * fVar43;
            auVar81 = vsubps_avx(auVar34,auVar113);
            fVar31 = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_1248._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
            local_1218._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_1228._0_4_ =
                 local_1218._4_4_ * auVar72._0_4_ +
                 fVar31 * auVar81._0_4_ + (float)local_1248._4_4_ * auVar80._0_4_;
            local_1228._4_4_ =
                 local_1218._4_4_ * auVar72._4_4_ +
                 fVar31 * auVar81._4_4_ + (float)local_1248._4_4_ * auVar80._4_4_;
            local_1228._8_4_ =
                 local_1218._4_4_ * auVar72._8_4_ +
                 fVar31 * auVar81._8_4_ + (float)local_1248._4_4_ * auVar80._8_4_;
            local_1228._12_4_ =
                 local_1218._4_4_ * auVar72._12_4_ +
                 fVar31 * auVar81._12_4_ + (float)local_1248._4_4_ * auVar80._12_4_;
            local_fe8 = vsubps_avx(local_f98,local_1238);
            local_ff8 = vsubps_avx(local_fa8,auVar79);
            fVar75 = fVar140 + local_1238._0_4_;
            fVar76 = fVar144 + local_1238._4_4_;
            fVar77 = fVar146 + local_1238._8_4_;
            fVar111 = fVar148 + local_1238._12_4_;
            fVar117 = fVar123 + auVar79._0_4_;
            fVar118 = fVar125 + auVar79._4_4_;
            fVar119 = fVar126 + auVar79._8_4_;
            fVar78 = fVar127 + auVar79._12_4_;
            fVar41 = local_ff8._0_4_;
            auVar130._0_4_ = fVar75 * fVar41;
            fVar42 = local_ff8._4_4_;
            auVar130._4_4_ = fVar76 * fVar42;
            fVar43 = local_ff8._8_4_;
            auVar130._8_4_ = fVar77 * fVar43;
            fVar71 = local_ff8._12_4_;
            auVar130._12_4_ = fVar111 * fVar71;
            fVar151 = local_fe8._0_4_;
            auVar142._0_4_ = fVar151 * fVar117;
            fVar155 = local_fe8._4_4_;
            auVar142._4_4_ = fVar155 * fVar118;
            fVar158 = local_fe8._8_4_;
            auVar142._8_4_ = fVar158 * fVar119;
            fVar161 = local_fe8._12_4_;
            auVar142._12_4_ = fVar161 * fVar78;
            auVar72 = vsubps_avx(auVar142,auVar130);
            auVar80 = vsubps_avx(local_f88,auVar91);
            fVar141 = auVar80._0_4_;
            auVar74._0_4_ = fVar141 * fVar117;
            fVar145 = auVar80._4_4_;
            auVar74._4_4_ = fVar145 * fVar118;
            fVar147 = auVar80._8_4_;
            auVar74._8_4_ = fVar147 * fVar119;
            fVar149 = auVar80._12_4_;
            auVar74._12_4_ = fVar149 * fVar78;
            fVar117 = fVar99 + auVar91._0_4_;
            fVar118 = fVar105 + auVar91._4_4_;
            fVar119 = fVar107 + auVar91._8_4_;
            fVar78 = fVar109 + auVar91._12_4_;
            auVar114._0_4_ = fVar117 * fVar41;
            auVar114._4_4_ = fVar118 * fVar42;
            auVar114._8_4_ = fVar119 * fVar43;
            auVar114._12_4_ = fVar78 * fVar71;
            auVar80 = vsubps_avx(auVar114,auVar74);
            auVar101._0_4_ = fVar151 * fVar117;
            auVar101._4_4_ = fVar155 * fVar118;
            auVar101._8_4_ = fVar158 * fVar119;
            auVar101._12_4_ = fVar161 * fVar78;
            auVar35._0_4_ = fVar141 * fVar75;
            auVar35._4_4_ = fVar145 * fVar76;
            auVar35._8_4_ = fVar147 * fVar77;
            auVar35._12_4_ = fVar149 * fVar111;
            auVar81 = vsubps_avx(auVar35,auVar101);
            local_1138._0_4_ =
                 local_1218._4_4_ * auVar72._0_4_ +
                 fVar31 * auVar81._0_4_ + (float)local_1248._4_4_ * auVar80._0_4_;
            local_1138._4_4_ =
                 local_1218._4_4_ * auVar72._4_4_ +
                 fVar31 * auVar81._4_4_ + (float)local_1248._4_4_ * auVar80._4_4_;
            local_1138._8_4_ =
                 local_1218._4_4_ * auVar72._8_4_ +
                 fVar31 * auVar81._8_4_ + (float)local_1248._4_4_ * auVar80._8_4_;
            local_1138._12_4_ =
                 local_1218._4_4_ * auVar72._12_4_ +
                 fVar31 * auVar81._12_4_ + (float)local_1248._4_4_ * auVar80._12_4_;
            auVar72 = vsubps_avx(auVar91,auVar92);
            fVar100 = auVar91._0_4_ + auVar92._0_4_;
            fVar106 = auVar91._4_4_ + auVar92._4_4_;
            fVar108 = auVar91._8_4_ + auVar92._8_4_;
            fVar110 = auVar91._12_4_ + auVar92._12_4_;
            auVar91 = vsubps_avx(local_1238,auVar44);
            fVar75 = local_1238._0_4_ + auVar44._0_4_;
            fVar76 = local_1238._4_4_ + auVar44._4_4_;
            fVar77 = local_1238._8_4_ + auVar44._8_4_;
            fVar111 = local_1238._12_4_ + auVar44._12_4_;
            auVar92 = vsubps_avx(auVar79,auVar57);
            fVar118 = auVar79._0_4_ + auVar57._0_4_;
            fVar119 = auVar79._4_4_ + auVar57._4_4_;
            fVar78 = auVar79._8_4_ + auVar57._8_4_;
            fVar55 = auVar79._12_4_ + auVar57._12_4_;
            fVar152 = auVar92._0_4_;
            auVar62._0_4_ = fVar152 * fVar75;
            fVar156 = auVar92._4_4_;
            auVar62._4_4_ = fVar156 * fVar76;
            fVar159 = auVar92._8_4_;
            auVar62._8_4_ = fVar159 * fVar77;
            fVar162 = auVar92._12_4_;
            auVar62._12_4_ = fVar162 * fVar111;
            fVar129 = auVar91._0_4_;
            auVar83._0_4_ = fVar129 * fVar118;
            fVar132 = auVar91._4_4_;
            auVar83._4_4_ = fVar132 * fVar119;
            fVar133 = auVar91._8_4_;
            auVar83._8_4_ = fVar133 * fVar78;
            fVar134 = auVar91._12_4_;
            auVar83._12_4_ = fVar134 * fVar55;
            auVar91 = vsubps_avx(auVar83,auVar62);
            fVar117 = auVar72._0_4_;
            auVar49._0_4_ = fVar117 * fVar118;
            fVar118 = auVar72._4_4_;
            auVar49._4_4_ = fVar118 * fVar119;
            fVar119 = auVar72._8_4_;
            auVar49._8_4_ = fVar119 * fVar78;
            fVar78 = auVar72._12_4_;
            auVar49._12_4_ = fVar78 * fVar55;
            auVar84._0_4_ = fVar152 * fVar100;
            auVar84._4_4_ = fVar156 * fVar106;
            auVar84._8_4_ = fVar159 * fVar108;
            auVar84._12_4_ = fVar162 * fVar110;
            auVar79 = vsubps_avx(auVar84,auVar49);
            auVar85._0_4_ = fVar129 * fVar100;
            auVar85._4_4_ = fVar132 * fVar106;
            auVar85._8_4_ = fVar133 * fVar108;
            auVar85._12_4_ = fVar134 * fVar110;
            auVar27._0_4_ = fVar117 * fVar75;
            auVar27._4_4_ = fVar118 * fVar76;
            auVar27._8_4_ = fVar119 * fVar77;
            auVar27._12_4_ = fVar78 * fVar111;
            auVar92 = vsubps_avx(auVar27,auVar85);
            local_1248._0_4_ = local_1248._4_4_;
            fStack_1240 = (float)local_1248._4_4_;
            fStack_123c = (float)local_1248._4_4_;
            local_1218._0_4_ = local_1218._4_4_;
            fStack_1210 = local_1218._4_4_;
            fStack_120c = local_1218._4_4_;
            auVar28._0_4_ =
                 local_1218._4_4_ * auVar91._0_4_ +
                 fVar31 * auVar92._0_4_ + (float)local_1248._4_4_ * auVar79._0_4_;
            auVar28._4_4_ =
                 local_1218._4_4_ * auVar91._4_4_ +
                 fVar31 * auVar92._4_4_ + (float)local_1248._4_4_ * auVar79._4_4_;
            auVar28._8_4_ =
                 local_1218._4_4_ * auVar91._8_4_ +
                 fVar31 * auVar92._8_4_ + (float)local_1248._4_4_ * auVar79._8_4_;
            auVar28._12_4_ =
                 local_1218._4_4_ * auVar91._12_4_ +
                 fVar31 * auVar92._12_4_ + (float)local_1248._4_4_ * auVar79._12_4_;
            local_1128._0_4_ = auVar28._0_4_ + (float)local_1228._0_4_ + local_1138._0_4_;
            local_1128._4_4_ = auVar28._4_4_ + local_1228._4_4_ + local_1138._4_4_;
            local_1128._8_4_ = auVar28._8_4_ + local_1228._8_4_ + local_1138._8_4_;
            local_1128._12_4_ = auVar28._12_4_ + local_1228._12_4_ + local_1138._12_4_;
            auVar91 = vminps_avx(local_1228,local_1138);
            auVar91 = vminps_avx(auVar91,auVar28);
            auVar63._8_4_ = 0x7fffffff;
            auVar63._0_8_ = 0x7fffffff7fffffff;
            auVar63._12_4_ = 0x7fffffff;
            local_1238 = vandps_avx(local_1128,auVar63);
            auVar64._0_4_ = local_1238._0_4_ * 1.1920929e-07;
            auVar64._4_4_ = local_1238._4_4_ * 1.1920929e-07;
            auVar64._8_4_ = local_1238._8_4_ * 1.1920929e-07;
            auVar64._12_4_ = local_1238._12_4_ * 1.1920929e-07;
            uVar13 = CONCAT44(auVar64._4_4_,auVar64._0_4_);
            auVar86._0_8_ = uVar13 ^ 0x8000000080000000;
            auVar86._8_4_ = -auVar64._8_4_;
            auVar86._12_4_ = -auVar64._12_4_;
            auVar91 = vcmpps_avx(auVar91,auVar86,5);
            auVar79 = vmaxps_avx(local_1228,local_1138);
            auVar79 = vmaxps_avx(auVar79,auVar28);
            auVar79 = vcmpps_avx(auVar79,auVar64,2);
            local_1008 = vorps_avx(auVar91,auVar79);
            auVar8._8_8_ = uStack_1150;
            auVar8._0_8_ = local_1158;
            auVar8 = auVar8 & local_1008;
            if ((((auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar8[0xf] < '\0') {
              auVar29._0_4_ = fVar151 * fVar56;
              auVar29._4_4_ = fVar155 * fVar70;
              auVar29._8_4_ = fVar158 * fVar93;
              auVar29._12_4_ = fVar161 * fVar94;
              auVar50._0_4_ = fVar150 * fVar41;
              auVar50._4_4_ = fVar154 * fVar42;
              auVar50._8_4_ = fVar157 * fVar43;
              auVar50._12_4_ = fVar160 * fVar71;
              auVar92 = vsubps_avx(auVar50,auVar29);
              auVar65._0_4_ = fVar129 * fVar41;
              auVar65._4_4_ = fVar132 * fVar42;
              auVar65._8_4_ = fVar133 * fVar43;
              auVar65._12_4_ = fVar134 * fVar71;
              auVar87._0_4_ = fVar151 * fVar152;
              auVar87._4_4_ = fVar155 * fVar156;
              auVar87._8_4_ = fVar158 * fVar159;
              auVar87._12_4_ = fVar161 * fVar162;
              auVar44 = vsubps_avx(auVar87,auVar65);
              auVar102._8_4_ = 0x7fffffff;
              auVar102._0_8_ = 0x7fffffff7fffffff;
              auVar102._12_4_ = 0x7fffffff;
              auVar91 = vandps_avx(auVar29,auVar102);
              auVar79 = vandps_avx(auVar65,auVar102);
              auVar91 = vcmpps_avx(auVar91,auVar79,1);
              local_10c8 = vblendvps_avx(auVar44,auVar92,auVar91);
              auVar51._0_4_ = fVar141 * fVar152;
              auVar51._4_4_ = fVar145 * fVar156;
              auVar51._8_4_ = fVar147 * fVar159;
              auVar51._12_4_ = fVar149 * fVar162;
              auVar66._0_4_ = fVar141 * fVar56;
              auVar66._4_4_ = fVar145 * fVar70;
              auVar66._8_4_ = fVar147 * fVar93;
              auVar66._12_4_ = fVar149 * fVar94;
              auVar88._0_4_ = fVar135 * fVar41;
              auVar88._4_4_ = fVar137 * fVar42;
              auVar88._8_4_ = fVar138 * fVar43;
              auVar88._12_4_ = fVar139 * fVar71;
              auVar92 = vsubps_avx(auVar66,auVar88);
              auVar95._0_4_ = fVar41 * fVar117;
              auVar95._4_4_ = fVar42 * fVar118;
              auVar95._8_4_ = fVar43 * fVar119;
              auVar95._12_4_ = fVar71 * fVar78;
              auVar44 = vsubps_avx(auVar95,auVar51);
              auVar91 = vandps_avx(auVar88,auVar102);
              auVar79 = vandps_avx(auVar51,auVar102);
              auVar91 = vcmpps_avx(auVar91,auVar79,1);
              local_10b8 = vblendvps_avx(auVar44,auVar92,auVar91);
              auVar36._0_4_ = fVar151 * fVar117;
              auVar36._4_4_ = fVar155 * fVar118;
              auVar36._8_4_ = fVar158 * fVar119;
              auVar36._12_4_ = fVar161 * fVar78;
              auVar67._0_4_ = fVar151 * fVar135;
              auVar67._4_4_ = fVar155 * fVar137;
              auVar67._8_4_ = fVar158 * fVar138;
              auVar67._12_4_ = fVar161 * fVar139;
              auVar89._0_4_ = fVar141 * fVar150;
              auVar89._4_4_ = fVar145 * fVar154;
              auVar89._8_4_ = fVar147 * fVar157;
              auVar89._12_4_ = fVar149 * fVar160;
              auVar96._0_4_ = fVar141 * fVar129;
              auVar96._4_4_ = fVar145 * fVar132;
              auVar96._8_4_ = fVar147 * fVar133;
              auVar96._12_4_ = fVar149 * fVar134;
              auVar92 = vsubps_avx(auVar67,auVar89);
              auVar44 = vsubps_avx(auVar96,auVar36);
              auVar91 = vandps_avx(auVar89,auVar102);
              auVar79 = vandps_avx(auVar36,auVar102);
              auVar91 = vcmpps_avx(auVar91,auVar79,1);
              local_10a8 = vblendvps_avx(auVar44,auVar92,auVar91);
              fVar56 = local_10c8._0_4_ * local_1218._4_4_ +
                       fVar31 * local_10a8._0_4_ + local_10b8._0_4_ * (float)local_1248._4_4_;
              fVar41 = local_10c8._4_4_ * local_1218._4_4_ +
                       fVar31 * local_10a8._4_4_ + local_10b8._4_4_ * (float)local_1248._4_4_;
              fVar70 = local_10c8._8_4_ * local_1218._4_4_ +
                       fVar31 * local_10a8._8_4_ + local_10b8._8_4_ * (float)local_1248._4_4_;
              fVar31 = local_10c8._12_4_ * local_1218._4_4_ +
                       fVar31 * local_10a8._12_4_ + local_10b8._12_4_ * (float)local_1248._4_4_;
              auVar68._0_4_ = fVar56 + fVar56;
              auVar68._4_4_ = fVar41 + fVar41;
              auVar68._8_4_ = fVar70 + fVar70;
              auVar68._12_4_ = fVar31 + fVar31;
              fVar42 = local_10c8._0_4_ * fVar99 +
                       local_10a8._0_4_ * fVar123 + local_10b8._0_4_ * fVar140;
              fVar93 = local_10c8._4_4_ * fVar105 +
                       local_10a8._4_4_ * fVar125 + local_10b8._4_4_ * fVar144;
              fVar43 = local_10c8._8_4_ * fVar107 +
                       local_10a8._8_4_ * fVar126 + local_10b8._8_4_ * fVar146;
              fVar94 = local_10c8._12_4_ * fVar109 +
                       local_10a8._12_4_ * fVar127 + local_10b8._12_4_ * fVar148;
              auVar91 = vrcpps_avx(auVar68);
              fVar31 = auVar91._0_4_;
              auVar103._0_4_ = auVar68._0_4_ * fVar31;
              fVar56 = auVar91._4_4_;
              auVar103._4_4_ = auVar68._4_4_ * fVar56;
              fVar41 = auVar91._8_4_;
              auVar103._8_4_ = auVar68._8_4_ * fVar41;
              fVar70 = auVar91._12_4_;
              auVar103._12_4_ = auVar68._12_4_ * fVar70;
              auVar115._8_4_ = 0x3f800000;
              auVar115._0_8_ = &DAT_3f8000003f800000;
              auVar115._12_4_ = 0x3f800000;
              auVar91 = vsubps_avx(auVar115,auVar103);
              local_10d8._0_4_ = (fVar42 + fVar42) * (fVar31 + fVar31 * auVar91._0_4_);
              local_10d8._4_4_ = (fVar93 + fVar93) * (fVar56 + fVar56 * auVar91._4_4_);
              local_10d8._8_4_ = (fVar43 + fVar43) * (fVar41 + fVar41 * auVar91._8_4_);
              local_10d8._12_4_ = (fVar94 + fVar94) * (fVar70 + fVar70 * auVar91._12_4_);
              uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar90._4_4_ = uVar11;
              auVar90._0_4_ = uVar11;
              auVar90._8_4_ = uVar11;
              auVar90._12_4_ = uVar11;
              auVar91 = vcmpps_avx(auVar90,local_10d8,2);
              fVar31 = (ray->super_RayK<1>).tfar;
              auVar97._4_4_ = fVar31;
              auVar97._0_4_ = fVar31;
              auVar97._8_4_ = fVar31;
              auVar97._12_4_ = fVar31;
              auVar79 = vcmpps_avx(local_10d8,auVar97,2);
              auVar91 = vandps_avx(auVar91,auVar79);
              auVar79 = vcmpps_avx(auVar68,_DAT_01feba10,4);
              auVar91 = vandps_avx(auVar79,auVar91);
              auVar9._8_8_ = uStack_1150;
              auVar9._0_8_ = local_1158;
              auVar79 = vandps_avx(local_1008,auVar9);
              auVar91 = vpslld_avx(auVar91,0x1f);
              auVar92 = vpsrad_avx(auVar91,0x1f);
              auVar91 = auVar79 & auVar92;
              if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar91 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar91 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar91[0xf] < '\0') {
                auVar91 = vandps_avx(auVar92,auVar79);
                local_1148 = local_1228;
                local_1108 = auVar91;
                uVar26 = context->scene;
                local_1208 = auVar91;
                auVar79 = vrcpps_avx(local_1128);
                fVar31 = auVar79._0_4_;
                auVar52._0_4_ = local_1128._0_4_ * fVar31;
                fVar56 = auVar79._4_4_;
                auVar52._4_4_ = local_1128._4_4_ * fVar56;
                fVar41 = auVar79._8_4_;
                auVar52._8_4_ = local_1128._8_4_ * fVar41;
                fVar70 = auVar79._12_4_;
                auVar52._12_4_ = local_1128._12_4_ * fVar70;
                auVar69._8_4_ = 0x3f800000;
                auVar69._0_8_ = &DAT_3f8000003f800000;
                auVar69._12_4_ = 0x3f800000;
                auVar79 = vsubps_avx(auVar69,auVar52);
                auVar37._0_4_ = fVar31 + fVar31 * auVar79._0_4_;
                auVar37._4_4_ = fVar56 + fVar56 * auVar79._4_4_;
                auVar37._8_4_ = fVar41 + fVar41 * auVar79._8_4_;
                auVar37._12_4_ = fVar70 + fVar70 * auVar79._12_4_;
                auVar53._8_4_ = 0x219392ef;
                auVar53._0_8_ = 0x219392ef219392ef;
                auVar53._12_4_ = 0x219392ef;
                auVar79 = vcmpps_avx(local_1238,auVar53,5);
                auVar79 = vandps_avx(auVar79,auVar37);
                auVar54._0_4_ = (float)local_1228._0_4_ * auVar79._0_4_;
                auVar54._4_4_ = local_1228._4_4_ * auVar79._4_4_;
                auVar54._8_4_ = local_1228._8_4_ * auVar79._8_4_;
                auVar54._12_4_ = local_1228._12_4_ * auVar79._12_4_;
                local_10f8 = vminps_avx(auVar54,auVar69);
                auVar38._0_4_ = local_1138._0_4_ * auVar79._0_4_;
                auVar38._4_4_ = local_1138._4_4_ * auVar79._4_4_;
                auVar38._8_4_ = local_1138._8_4_ * auVar79._8_4_;
                auVar38._12_4_ = local_1138._12_4_ * auVar79._12_4_;
                local_10e8 = vminps_avx(auVar38,auVar69);
                auVar39._8_4_ = 0x7f800000;
                auVar39._0_8_ = 0x7f8000007f800000;
                auVar39._12_4_ = 0x7f800000;
                auVar79 = vblendvps_avx(auVar39,local_10d8,auVar91);
                auVar92 = vshufps_avx(auVar79,auVar79,0xb1);
                auVar92 = vminps_avx(auVar92,auVar79);
                auVar44 = vshufpd_avx(auVar92,auVar92,1);
                auVar92 = vminps_avx(auVar44,auVar92);
                auVar79 = vcmpps_avx(auVar79,auVar92,0);
                auVar92 = auVar91 & auVar79;
                _local_1248 = local_10d8;
                if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar92 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar92[0xf] < '\0') {
                  auVar91 = vandps_avx(auVar79,auVar91);
                }
                lVar15 = lVar15 + uVar24;
                uVar11 = vmovmskps_avx(auVar91);
                uVar13 = CONCAT44((int)((ulong)pRVar12 >> 0x20),uVar11);
                pRVar22 = (RayHit *)0x0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> (long)pRVar22 & 1) == 0;
                      pRVar22 = (RayHit *)((long)(pRVar22->super_RayK<1>).org.field_0.m128 + 1)) {
                  }
                }
                local_1218 = uVar26;
                do {
                  uVar3 = *(uint *)(lVar15 + 0x90 + (long)pRVar22 * 4);
                  pRVar12 = (RayHit *)(ulong)uVar3;
                  pGVar5 = (((Scene *)uVar26)->geometries).items[(long)pRVar12].ptr;
                  if ((pGVar5->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_1208 + (long)pRVar22 * 4) = 0;
                  }
                  else {
                    pRVar6 = context->args;
                    if ((pRVar6->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar31 = *(float *)(local_10f8 + (long)pRVar22 * 4);
                      fVar56 = *(float *)(local_10e8 + (long)pRVar22 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_10d8 + (long)pRVar22 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_10c8 + (long)pRVar22 * 4);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_10b8 + (long)pRVar22 * 4);
                      (ray->Ng).field_0.field_0.z = *(float *)(local_10a8 + (long)pRVar22 * 4);
                      ray->u = fVar31;
                      ray->v = fVar56;
                      ray->primID = *(uint *)(lVar15 + 0xa0 + (long)pRVar22 * 4);
                      ray->geomID = uVar3;
                      pRVar7 = context->user;
                      ray->instID[0] = pRVar7->instID[0];
                      pRVar12 = (RayHit *)0x0;
                      ray->instPrimID[0] = pRVar7->instPrimID[0];
                      break;
                    }
                    local_11f8.context = context->user;
                    local_1198 = *(float *)(local_10c8 + (long)pRVar22 * 4);
                    local_1194 = *(undefined4 *)(local_10b8 + (long)pRVar22 * 4);
                    local_1190 = *(undefined4 *)(local_10a8 + (long)pRVar22 * 4);
                    local_118c = *(undefined4 *)(local_10f8 + (long)pRVar22 * 4);
                    local_1188 = *(undefined4 *)(local_10e8 + (long)pRVar22 * 4);
                    local_1184 = *(undefined4 *)(lVar15 + 0xa0 + (long)pRVar22 * 4);
                    local_1180 = uVar3;
                    local_117c = (local_11f8.context)->instID[0];
                    local_1178 = (local_11f8.context)->instPrimID[0];
                    local_1228._0_4_ = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_10d8 + (long)pRVar22 * 4);
                    local_124c = (undefined1  [4])0xffffffff;
                    local_11f8.valid = (int *)local_124c;
                    local_11f8.geometryUserPtr = pGVar5->userPtr;
                    local_11f8.ray = (RTCRayN *)ray;
                    local_11f8.hit = (RTCHitN *)&local_1198;
                    local_11f8.N = 1;
                    if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_012af529:
                      if (pRVar6->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar6->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar6->filter)(&local_11f8);
                          context = local_1258;
                          uVar16 = local_1260;
                          uVar19 = local_1268;
                        }
                        if ((((RayK<1> *)local_11f8.valid)->org).field_0.m128[0] == 0.0)
                        goto LAB_012af626;
                      }
                      (((Vec3f *)((long)local_11f8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_11f8.hit;
                      (((Vec3f *)((long)local_11f8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_11f8.hit + 4);
                      (((Vec3f *)((long)local_11f8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_11f8.hit + 8);
                      *(float *)((long)local_11f8.ray + 0x3c) = *(float *)(local_11f8.hit + 0xc);
                      *(float *)((long)local_11f8.ray + 0x40) = *(float *)(local_11f8.hit + 0x10);
                      *(float *)((long)local_11f8.ray + 0x44) = *(float *)(local_11f8.hit + 0x14);
                      *(float *)((long)local_11f8.ray + 0x48) = *(float *)(local_11f8.hit + 0x18);
                      *(float *)((long)local_11f8.ray + 0x4c) = *(float *)(local_11f8.hit + 0x1c);
                      *(float *)((long)local_11f8.ray + 0x50) = *(float *)(local_11f8.hit + 0x20);
                      pRVar12 = (RayHit *)local_11f8.ray;
                    }
                    else {
                      local_1238._0_8_ = pRVar18;
                      (*pGVar5->intersectionFilterN)(&local_11f8);
                      context = local_1258;
                      uVar16 = local_1260;
                      pRVar18 = (RayHit *)local_1238._0_8_;
                      uVar19 = local_1268;
                      if ((((RayK<1> *)local_11f8.valid)->org).field_0.m128[0] != 0.0)
                      goto LAB_012af529;
LAB_012af626:
                      (ray->super_RayK<1>).tfar = (float)local_1228._0_4_;
                      pRVar12 = (RayHit *)local_11f8.valid;
                    }
                    *(undefined4 *)(local_1208 + (long)pRVar22 * 4) = 0;
                    fVar31 = (ray->super_RayK<1>).tfar;
                    auVar40._4_4_ = fVar31;
                    auVar40._0_4_ = fVar31;
                    auVar40._8_4_ = fVar31;
                    auVar40._12_4_ = fVar31;
                    auVar91 = vcmpps_avx(_local_1248,auVar40,2);
                    local_1208 = vandps_avx(auVar91,local_1208);
                    uVar26 = local_1218;
                  }
                  if ((((local_1208 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_1208 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_1208 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_1208[0xf]) break;
                  BVHNIntersector1<4,1,true,embree::avx::ArrayIntersector1<embree::avx::TriangleMvIntersector1Pluecker<4,true>>>
                  ::intersect(&local_11f8);
                  context = local_1258;
                  uVar16 = local_1260;
                  uVar19 = local_1268;
                  pRVar22 = (RayHit *)local_11f8.valid;
                } while( true );
              }
            }
            pRVar18 = (RayHit *)((long)&(pRVar18->super_RayK<1>).org.field_0 + 1);
          } while (pRVar18 != local_11a8);
        }
        fVar31 = (ray->super_RayK<1>).tfar;
        auVar30 = ZEXT1664(CONCAT412(fVar31,CONCAT48(fVar31,CONCAT44(fVar31,fVar31))));
        auVar104 = ZEXT1664(local_1018);
        auVar116 = ZEXT1664(local_1028);
        auVar122 = ZEXT1664(local_1038);
        auVar124 = ZEXT1664(local_1048);
        auVar128 = ZEXT1664(local_1058);
        auVar131 = ZEXT1664(local_1068);
        auVar136 = ZEXT1664(local_1078);
        auVar143 = ZEXT1664(local_1088);
        auVar153 = ZEXT1664(local_1098);
        auVar98 = ZEXT1664(local_1168);
        uVar13 = local_11b0;
        uVar14 = local_11c8;
        uVar21 = local_11c0;
        uVar25 = local_11b8;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }